

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::TableDrawBorders(ImGuiTable *table)

{
  ImVec2 *pIVar1;
  float fVar2;
  char cVar3;
  ImGuiWindow *pIVar4;
  ImDrawList *draw_list;
  ImVec2 IVar5;
  ImVec2 IVar6;
  ImGuiCol idx;
  bool bVar7;
  ImU32 IVar8;
  uint uVar9;
  char *pcVar10;
  ImGuiTableColumn *pIVar11;
  ulong uVar12;
  float fVar13;
  ImVec2 local_68;
  float local_60;
  float local_5c;
  ImRect outer_border;
  
  pIVar4 = table->InnerWindow;
  bVar7 = ImRect::Overlaps(&table->OuterWindow->ClipRect,&table->OuterRect);
  if (!bVar7) {
    return;
  }
  draw_list = pIVar4->DrawList;
  ImDrawListSplitter::SetCurrentChannel(table->DrawSplitter,draw_list,0);
  ImDrawList::PushClipRect
            (draw_list,(table->Bg0ClipRectForDrawCmd).Min,(table->Bg0ClipRectForDrawCmd).Max,false);
  local_60 = (table->InnerRect).Min.y;
  fVar2 = (table->InnerRect).Max.y;
  local_5c = local_60;
  if (table->IsUsingHeaders == true) {
    fVar13 = local_60;
    if (table->FreezeRowsCount < '\x01') {
      fVar13 = (table->WorkRect).Min.y;
    }
    fVar13 = fVar13 + table->LastFirstRowHeight;
    local_5c = fVar2;
    if (fVar13 <= fVar2) {
      local_5c = fVar13;
    }
  }
  uVar9 = table->Flags;
  if ((uVar9 >> 9 & 1) != 0) {
    uVar12 = 0;
    while ((long)uVar12 < (long)table->ColumnsCount) {
      if ((table->EnabledMaskByDisplayOrder >> (uVar12 & 0x3f) & 1) == 0) {
        uVar12 = uVar12 + 1;
      }
      else {
        pcVar10 = ImSpan<signed_char>::operator[](&table->DisplayOrderToIndex,(int)uVar12);
        cVar3 = *pcVar10;
        pIVar11 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,(int)cVar3);
        if (table->ResizedColumn == cVar3) {
          bVar7 = table->InstanceInteracted == table->InstanceCurrent;
        }
        else {
          bVar7 = false;
        }
        uVar12 = uVar12 + 1;
        fVar13 = pIVar11->MaxX;
        pIVar1 = &(table->InnerClipRect).Max;
        if ((bool)((fVar13 < pIVar1->x || fVar13 == pIVar1->x) | bVar7)) {
          if ((((pIVar11->NextEnabledColumn != -1) || ((pIVar11->Flags & 0x40000020U) == 0)) ||
              ((table->Flags & 0x1e000U) == 0x4000)) && ((pIVar11->ClipRect).Min.x < fVar13)) {
            fVar13 = fVar2;
            if ((table->HoveredColumnBorder == cVar3 || bVar7) ||
               (uVar12 == (uint)(int)table->FreezeColumnsCount)) {
              if (bVar7) {
                idx = 0x1d;
              }
              else {
                if (table->HoveredColumnBorder != cVar3) {
                  IVar8 = table->BorderColorStrong;
                  goto LAB_001bfe98;
                }
                idx = 0x1c;
              }
              IVar8 = GetColorU32(idx,1.0);
            }
            else {
              bVar7 = (table->Flags & 0x1800) == 0;
              if (!bVar7) {
                fVar13 = local_5c;
              }
              IVar8 = table->RowBgColor[(ulong)bVar7 + 2];
            }
LAB_001bfe98:
            if (local_60 < fVar13) {
              outer_border.Min.x = pIVar11->MaxX;
              outer_border.Min.y = local_60;
              local_68.y = fVar13;
              local_68.x = outer_border.Min.x;
              ImDrawList::AddLine(draw_list,&outer_border.Min,&local_68,IVar8,1.0);
            }
          }
        }
      }
    }
    uVar9 = table->Flags;
  }
  if ((uVar9 & 0x500) == 0) goto LAB_001c000a;
  IVar5 = (table->OuterRect).Min;
  IVar6 = (table->OuterRect).Max;
  outer_border.Min.x = IVar5.x;
  outer_border.Min.y = IVar5.y;
  outer_border.Max.x = IVar6.x;
  outer_border.Max.y = IVar6.y;
  IVar8 = table->BorderColorStrong;
  if ((uVar9 & 0x500) == 0x500) {
    ImDrawList::AddRect(draw_list,&outer_border.Min,&outer_border.Max,IVar8,0.0,0,1.0);
  }
  else {
    if ((uVar9 >> 10 & 1) == 0) {
      if ((uVar9 >> 8 & 1) == 0) goto LAB_001c0007;
      local_68.y = outer_border.Min.y;
      local_68.x = outer_border.Max.x;
      ImDrawList::AddLine(draw_list,&outer_border.Min,&local_68,IVar8,1.0);
      local_68.y = outer_border.Max.y;
      local_68.x = outer_border.Min.x;
    }
    else {
      local_68.y = outer_border.Max.y;
      local_68.x = outer_border.Min.x;
      ImDrawList::AddLine(draw_list,&outer_border.Min,&local_68,IVar8,1.0);
      local_68.y = outer_border.Min.y;
      local_68.x = outer_border.Max.x;
    }
    ImDrawList::AddLine(draw_list,&local_68,&outer_border.Max,IVar8,1.0);
  }
LAB_001c0007:
  uVar9 = table->Flags;
LAB_001c000a:
  if ((((char)uVar9 < '\0') && (fVar2 = table->RowPosY2, fVar2 < (table->OuterRect).Max.y)) &&
     (((table->BgClipRect).Min.y <= fVar2 && (fVar2 < (table->BgClipRect).Max.y)))) {
    outer_border.Min.x = table->BorderX1;
    local_68.y = fVar2;
    local_68.x = table->BorderX2;
    outer_border.Min.y = fVar2;
    ImDrawList::AddLine(draw_list,&outer_border.Min,&local_68,table->BorderColorLight,1.0);
  }
  ImDrawList::PopClipRect(draw_list);
  return;
}

Assistant:

void ImGui::TableDrawBorders(ImGuiTable* table)
{
    ImGuiWindow* inner_window = table->InnerWindow;
    if (!table->OuterWindow->ClipRect.Overlaps(table->OuterRect))
        return;

    ImDrawList* inner_drawlist = inner_window->DrawList;
    table->DrawSplitter->SetCurrentChannel(inner_drawlist, TABLE_DRAW_CHANNEL_BG0);
    inner_drawlist->PushClipRect(table->Bg0ClipRectForDrawCmd.Min, table->Bg0ClipRectForDrawCmd.Max, false);

    // Draw inner border and resizing feedback
    const float border_size = TABLE_BORDER_SIZE;
    const float draw_y1 = table->InnerRect.Min.y;
    const float draw_y2_body = table->InnerRect.Max.y;
    const float draw_y2_head = table->IsUsingHeaders ? ImMin(table->InnerRect.Max.y, (table->FreezeRowsCount >= 1 ? table->InnerRect.Min.y : table->WorkRect.Min.y) + table->LastFirstRowHeight) : draw_y1;
    if (table->Flags & ImGuiTableFlags_BordersInnerV)
    {
        for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
        {
            if (!(table->EnabledMaskByDisplayOrder & ((ImU64)1 << order_n)))
                continue;

            const int column_n = table->DisplayOrderToIndex[order_n];
            ImGuiTableColumn* column = &table->Columns[column_n];
            const bool is_hovered = (table->HoveredColumnBorder == column_n);
            const bool is_resized = (table->ResizedColumn == column_n) && (table->InstanceInteracted == table->InstanceCurrent);
            const bool is_resizable = (column->Flags & (ImGuiTableColumnFlags_NoResize | ImGuiTableColumnFlags_NoDirectResize_)) == 0;
            const bool is_frozen_separator = (table->FreezeColumnsCount == order_n + 1);
            if (column->MaxX > table->InnerClipRect.Max.x && !is_resized)
                continue;

            // Decide whether right-most column is visible
            if (column->NextEnabledColumn == -1 && !is_resizable)
                if ((table->Flags & ImGuiTableFlags_SizingMask_) != ImGuiTableFlags_SizingFixedSame || (table->Flags & ImGuiTableFlags_NoHostExtendX))
                    continue;
            if (column->MaxX <= column->ClipRect.Min.x) // FIXME-TABLE FIXME-STYLE: Assume BorderSize==1, this is problematic if we want to increase the border size..
                continue;

            // Draw in outer window so right-most column won't be clipped
            // Always draw full height border when being resized/hovered, or on the delimitation of frozen column scrolling.
            ImU32 col;
            float draw_y2;
            if (is_hovered || is_resized || is_frozen_separator)
            {
                draw_y2 = draw_y2_body;
                col = is_resized ? GetColorU32(ImGuiCol_SeparatorActive) : is_hovered ? GetColorU32(ImGuiCol_SeparatorHovered) : table->BorderColorStrong;
            }
            else
            {
                draw_y2 = (table->Flags & (ImGuiTableFlags_NoBordersInBody | ImGuiTableFlags_NoBordersInBodyUntilResize)) ? draw_y2_head : draw_y2_body;
                col = (table->Flags & (ImGuiTableFlags_NoBordersInBody | ImGuiTableFlags_NoBordersInBodyUntilResize)) ? table->BorderColorStrong : table->BorderColorLight;
            }

            if (draw_y2 > draw_y1)
                inner_drawlist->AddLine(ImVec2(column->MaxX, draw_y1), ImVec2(column->MaxX, draw_y2), col, border_size);
        }
    }

    // Draw outer border
    // FIXME: could use AddRect or explicit VLine/HLine helper?
    if (table->Flags & ImGuiTableFlags_BordersOuter)
    {
        // Display outer border offset by 1 which is a simple way to display it without adding an extra draw call
        // (Without the offset, in outer_window it would be rendered behind cells, because child windows are above their
        // parent. In inner_window, it won't reach out over scrollbars. Another weird solution would be to display part
        // of it in inner window, and the part that's over scrollbars in the outer window..)
        // Either solution currently won't allow us to use a larger border size: the border would clipped.
        const ImRect outer_border = table->OuterRect;
        const ImU32 outer_col = table->BorderColorStrong;
        if ((table->Flags & ImGuiTableFlags_BordersOuter) == ImGuiTableFlags_BordersOuter)
        {
            inner_drawlist->AddRect(outer_border.Min, outer_border.Max, outer_col, 0.0f, 0, border_size);
        }
        else if (table->Flags & ImGuiTableFlags_BordersOuterV)
        {
            inner_drawlist->AddLine(outer_border.Min, ImVec2(outer_border.Min.x, outer_border.Max.y), outer_col, border_size);
            inner_drawlist->AddLine(ImVec2(outer_border.Max.x, outer_border.Min.y), outer_border.Max, outer_col, border_size);
        }
        else if (table->Flags & ImGuiTableFlags_BordersOuterH)
        {
            inner_drawlist->AddLine(outer_border.Min, ImVec2(outer_border.Max.x, outer_border.Min.y), outer_col, border_size);
            inner_drawlist->AddLine(ImVec2(outer_border.Min.x, outer_border.Max.y), outer_border.Max, outer_col, border_size);
        }
    }
    if ((table->Flags & ImGuiTableFlags_BordersInnerH) && table->RowPosY2 < table->OuterRect.Max.y)
    {
        // Draw bottom-most row border
        const float border_y = table->RowPosY2;
        if (border_y >= table->BgClipRect.Min.y && border_y < table->BgClipRect.Max.y)
            inner_drawlist->AddLine(ImVec2(table->BorderX1, border_y), ImVec2(table->BorderX2, border_y), table->BorderColorLight, border_size);
    }

    inner_drawlist->PopClipRect();
}